

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall
MPLSParser::parseSubPathEntryExtension(MPLSParser *this,uint8_t *data,uint32_t dataLen)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int j;
  uint uVar5;
  BitStreamReader reader;
  char clip_Information_file_name [6];
  
  reader.super_BitStream.m_totalBits = 0;
  reader.m_curVal = 0;
  reader.m_bitLeft = 0;
  reader.super_BitStream.m_buffer = (uint *)0x0;
  reader.super_BitStream.m_initBuffer = (uint *)0x0;
  BitStreamReader::setBuffer(&reader,data,data + dataLen);
  BitStreamReader::skipBits(&reader,0x20);
  uVar2 = BitStreamReader::getBits(&reader,0x10);
  if ((short)uVar2 != 0) {
    BitStreamReader::skipBits(&reader,0x20);
    BitStreamReader::skipBits(&reader,8);
    uVar2 = BitStreamReader::getBits(&reader,8);
    if ((uVar2 & 0xfe) == 8) {
      BitStreamReader::skipBits(&reader,0x18);
      uVar2 = BitStreamReader::getBits(&reader,8);
      for (uVar3 = 0; uVar3 != (uVar2 & 0xff); uVar3 = uVar3 + 1) {
        BitStreamReader::skipBits(&reader,0x10);
        CLPIStreamInfo::readString(clip_Information_file_name,&reader,5);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char(&)[6]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->m_mvcFiles,&clip_Information_file_name);
        BitStreamReader::skipBits(&reader,0x20);
        BitStreamReader::skipBits(&reader,0x1f);
        bVar1 = BitStreamReader::getBit(&reader);
        BitStreamReader::skipBits(&reader,8);
        BitStreamReader::skipBits(&reader,0x20);
        BitStreamReader::skipBits(&reader,0x20);
        BitStreamReader::skipBits(&reader,0x10);
        BitStreamReader::skipBits(&reader,0x20);
        if (bVar1) {
          uVar4 = BitStreamReader::getBits(&reader,8);
          BitStreamReader::skipBits(&reader,8);
          for (uVar5 = 1; uVar5 < (uVar4 & 0xff); uVar5 = uVar5 + 1) {
            CLPIStreamInfo::readString(clip_Information_file_name,&reader,5);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char(&)[6]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->m_mvcFiles,&clip_Information_file_name);
            BitStreamReader::skipBits(&reader,0x20);
            BitStreamReader::skipBits(&reader,8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void MPLSParser::parseSubPathEntryExtension(uint8_t* data, const uint32_t dataLen)
{
    BitStreamReader reader{};
    reader.setBuffer(data, data + dataLen);
    try
    {
        reader.skipBits(32);  // length
        const auto size = reader.getBits<uint16_t>(16);
        // for (int i = 0; i < size; ++i)
        if (size > 0)
        {
            // subpath extension
            reader.skipBits(32);  // length
            reader.skipBits(8);   // reserved field
            const auto type = reader.getBits<uint8_t>(8);
            if (type == 8 || type == 9)
            {
                reader.skipBits(24);
                const auto subPlayItems = reader.getBits<uint8_t>(8);
                for (int i = 0; i < subPlayItems; ++i)
                {
                    reader.skipBits(16);
                    char clip_Information_file_name[6];
                    CLPIStreamInfo::readString(clip_Information_file_name, reader, 5);
                    m_mvcFiles.emplace_back(clip_Information_file_name);
                    reader.skipBits(32);  // clip codec identifier
                    reader.skipBits(31);  // reserved, condition
                    const bool isMulticlip = reader.getBit();
                    reader.skipBits(8);   // ref to stc id
                    reader.skipBits(32);  // in time
                    reader.skipBits(32);  // out time
                    reader.skipBits(16);  // sync play item id
                    reader.skipBits(32);  // sync start
                    if (isMulticlip)
                    {
                        const auto numberOfClipEntries = reader.getBits<uint8_t>(8);
                        reader.skipBits(8);  // reserved
                        for (int j = 1; j < numberOfClipEntries; ++j)
                        {
                            CLPIStreamInfo::readString(clip_Information_file_name, reader, 5);
                            m_mvcFiles.emplace_back(clip_Information_file_name);
                            reader.skipBits(32);  // clip codec identifier
                            reader.skipBits(8);   // ref to stc id
                        }
                    }
                }
            }
        }
    }
    catch (...)
    {
    }
}